

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

basic_variable<std::allocator<char>_> *
trial::dynamic::convert::
overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_void>
::into(basic_variable<std::allocator<char>_> *__return_storage_ptr__,
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      *array,error_code *param_2)

{
  pointer pbVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *entry;
  pointer other;
  
  basic_array<std::allocator<char>_>::make();
  pbVar1 = (array->
           super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (other = (array->
               super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; other != pbVar1; other = other + 1) {
    detail::
    overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_void>
    ::append(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_variable<Allocator> into(const std::vector<T>& array,
                                          std::error_code&)
    {
        auto result = basic_array<Allocator>::make();
        for (const auto& entry : array)
        {
            result += entry;
        }
        return result;
    }